

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelEvent.cpp
# Opt level: O0

void __thiscall MIDI::ChannelEvent::debug(ChannelEvent *this)

{
  _Setbase _Var1;
  ostream *poVar2;
  ChannelEvent *this_local;
  
  switch(this->_command) {
  case '\0':
    poVar2 = std::operator<<((ostream *)&std::cout,"\tInvalid MIDI Channel Event");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  default:
    poVar2 = std::operator<<((ostream *)&std::cout,"\tUnknown MIDI Channel Event");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tCommand: 0x");
    _Var1 = std::setbase(0x10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)this->_command);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tChannel: ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_channel);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tParam 1: 0x");
    _Var1 = std::setbase(0x10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tParam 2: 0x");
    _Var1 = std::setbase(0x10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param2);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case '\b':
    poVar2 = std::operator<<((ostream *)&std::cout,"\tEnd Note ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tVelocity: ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param2);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case '\t':
    poVar2 = std::operator<<((ostream *)&std::cout,"\tStart Note ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tVelocity: ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param2);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case '\n':
    poVar2 = std::operator<<((ostream *)&std::cout,"\tNote Aftertouch");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tValue: ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param2);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case '\v':
    poVar2 = std::operator<<((ostream *)&std::cout,"\tController Event");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tChannel: ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_channel);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tType: 0x");
    _Var1 = std::setbase(0x10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tValue: 0x");
    _Var1 = std::setbase(0x10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param2);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case '\f':
    poVar2 = std::operator<<((ostream *)&std::cout,"\tProgram Change to ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case '\r':
    poVar2 = std::operator<<((ostream *)&std::cout,"\tChannel Aftertouch");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tValue: ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case '\x0e':
    poVar2 = std::operator<<((ostream *)&std::cout,"\tPitch Bend");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tPitch Value (MSB): ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\t\tPitch Value (LSB): ");
    _Var1 = std::setbase(10);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_param2);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ChannelEvent::debug()
  {
    switch(_command)
      {
      case MIDI_CHEVENT_INVALID:
	cout << "\tInvalid MIDI Channel Event" << endl;
	break;
      case MIDI_CHEVENT_NOTEOFF:
	cout << "\tEnd Note " << setbase(10) << _param1 << endl;
	cout << "\t\tVelocity: " << setbase(10) << _param2 << endl;
	break;
      case MIDI_CHEVENT_NOTEON:
	cout << "\tStart Note " << setbase(10) << _param1 << endl;
	cout << "\t\tVelocity: " << setbase(10) << _param2 << endl;
	break;
      case MIDI_CHEVENT_NOTEAFTERTOUCH:
	cout << "\tNote Aftertouch" << setbase(10) << _param1 << endl;
	cout << "\t\tValue: " << setbase(10) << _param2 << endl;
	break;
      case MIDI_CHEVENT_CONTROLLER:
	cout << "\tController Event" << endl;
	cout << "\t\tChannel: " << setbase(10) << _channel << endl;
	cout << "\t\tType: 0x" << setbase(16) << _param1 << endl;
	cout << "\t\tValue: 0x" << setbase(16) << _param2 << endl;
	break;
      case MIDI_CHEVENT_PROGRAMCHANGE:
	cout << "\tProgram Change to " << setbase(10) << _param1 << endl;
	break;
      case MIDI_CHEVENT_CHANNELAFTERTOUCH:
	cout << "\tChannel Aftertouch" << endl;
	cout << "\t\tValue: " << setbase(10) << _param1 << endl;
	break;
      case MIDI_CHEVENT_PITCHBEND:
	cout << "\tPitch Bend" << endl;
	cout << "\t\tPitch Value (MSB): " << setbase(10) << _param1 << endl;
	cout << "\t\tPitch Value (LSB): " << setbase(10) << _param2 << endl;
	break;
      default:
	cout << "\tUnknown MIDI Channel Event" << endl;
	cout << "\t\tCommand: 0x" << setbase(16) << (unsigned int)_command << endl;
	cout << "\t\tChannel: " << setbase(10) << _channel << endl;
	cout << "\t\tParam 1: 0x" << setbase(16) << _param1 << endl;
	cout << "\t\tParam 2: 0x" << setbase(16) << _param2 << endl;
	break;
      }   
  }